

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::UntypedMapBase::DeleteNode(UntypedMapBase *this,NodeBase *node)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  MessageLite *this_00;
  
  switch((this->type_info_).field_0x3 & 0xf) {
  case 0:
    GetKey<bool>(this,node);
    break;
  case 1:
    GetKey<unsigned_int>(this,node);
    break;
  case 2:
    GetKey<unsigned_long>(this,node);
    break;
  default:
    Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
                ,0x1f0);
  case 5:
    pbVar1 = GetKey<std::__cxx11::string>(this,node);
    std::__cxx11::string::~string((string *)pbVar1);
  }
  switch((byte)(this->type_info_).field_0x3 >> 4) {
  case 0:
    GetValue<bool>(this,node);
    break;
  case 1:
    GetValue<unsigned_int>(this,node);
    break;
  case 2:
    GetValue<unsigned_long>(this,node);
    break;
  case 3:
    GetValue<float>(this,node);
    break;
  case 4:
    GetValue<double>(this,node);
    break;
  case 5:
    pbVar1 = GetValue<std::__cxx11::string>(this,node);
    std::__cxx11::string::~string((string *)pbVar1);
    break;
  case 6:
    this_00 = GetValue<google::protobuf::MessageLite>(this,node);
    MessageLite::DestroyInstance(this_00);
    break;
  default:
    Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
                ,0x207);
  }
  DeallocNode(this,node);
  return;
}

Assistant:

void UntypedMapBase::DeleteNode(NodeBase* node) {
  const auto destroy = absl::Overload{
      [](std::string* str) { str->~basic_string(); },
      [](MessageLite* msg) { msg->DestroyInstance(); }, [](void*) {}};
  VisitKey(node, destroy);
  VisitValue(node, destroy);
  DeallocNode(node);
}